

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

uint Dau_DecReadSet(char *pStr)

{
  uint uVar1;
  char cVar2;
  uint in_ESI;
  char *pcVar3;
  
  cVar2 = *pStr;
  if (cVar2 == '\0') {
    return 0;
  }
  pcVar3 = pStr + 1;
  uVar1 = 0;
  do {
    if ((byte)(cVar2 + 0x9fU) < 0x1a) {
      in_ESI = 1 << ((cVar2 + 0x9fU) * '\x02' & 0x1f);
    }
    else if (0x19 < (byte)(cVar2 + 0xbfU)) {
      return uVar1;
    }
    uVar1 = uVar1 | in_ESI;
    cVar2 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar2 != '\0');
  return uVar1;
}

Assistant:

unsigned Dau_DecReadSet( char * pStr )
{
    unsigned uSet = 0; int v;
    for ( v = 0; pStr[v]; v++ )
    {
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1));
        else if ( pStr[v] >= 'A' && pStr[v] <= 'Z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1)) | (1 << (((pStr[v] - 'a') << 1)+1));
        else break;
    }
    return uSet;
}